

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O3

bool __thiscall SQClass::GetAttributes(SQClass *this,SQObjectPtr *key,SQObjectPtr *outval)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQClassMember *pSVar4;
  SQTable *pSVar5;
  SQTable *pSVar6;
  bool bVar7;
  ulong uVar8;
  SQClassMemberVec *pSVar9;
  SQObjectPtr idx;
  SQObjectPtr local_28;
  
  local_28.super_SQObject._type = OT_NULL;
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  bVar7 = SQTable::Get(this->_members,key,&local_28);
  if (bVar7) {
    pSVar9 = &this->_methods;
    if (((uint)local_28.super_SQObject._unVal.fFloat >> 0x19 & 1) != 0) {
      pSVar9 = &this->_defaultvalues;
    }
    pSVar4 = pSVar9->_vals;
    uVar8 = (ulong)(((uint)local_28.super_SQObject._unVal.fFloat & 0xffffff) << 5);
    SVar2 = (outval->super_SQObject)._type;
    pSVar5 = (outval->super_SQObject)._unVal.pTable;
    pSVar6 = *(SQTable **)((long)&(pSVar4->attrs).super_SQObject._unVal + uVar8);
    (outval->super_SQObject)._unVal.pTable = pSVar6;
    SVar3 = *(SQObjectType *)((long)&(pSVar4->attrs).super_SQObject._type + uVar8);
    (outval->super_SQObject)._type = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  return bVar7;
}

Assistant:

bool SQClass::GetAttributes(const SQObjectPtr &key,SQObjectPtr &outval)
{
    SQObjectPtr idx;
    if(_members->Get(key,idx)) {
        outval = (_isfield(idx)?_defaultvalues[_member_idx(idx)].attrs:_methods[_member_idx(idx)].attrs);
        return true;
    }
    return false;
}